

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkPredict_Bootstrap
              (ARKodeMem ark_mem,sunrealtype hj,sunrealtype tau,int nvec,sunrealtype *cvals,
              N_Vector *Xvecs,N_Vector yguess)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  ARKodeMem in_RDI;
  undefined8 in_R8;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  int retval;
  int i;
  sunrealtype a2;
  sunrealtype a1;
  sunrealtype a0;
  int local_5c;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xb85,"arkPredict_Bootstrap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"ARKodeMem structure is NULL");
    local_4 = -0x15;
  }
  else if (in_RDI->interp == (ARKInterp)0x0) {
    arkProcessError(in_RDI,-0x15,0xb8b,"arkPredict_Bootstrap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"ARKodeInterpMem structure is NULL");
    local_4 = -0x15;
  }
  else {
    dVar2 = ((in_XMM1_Qa * in_XMM1_Qa) / 2.0) / in_XMM0_Qa;
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      in_RDX[local_5c + 2] = dVar2 * (double)in_RDX[local_5c];
      in_RCX[local_5c + 2] = in_RCX[local_5c];
    }
    *in_RDX = 0x3ff0000000000000;
    *in_RCX = in_RDI->yn;
    in_RDX[1] = in_XMM1_Qa - dVar2;
    in_RCX[1] = in_RDI->fn;
    iVar1 = N_VLinearCombination(in_ESI + 2,in_RDX,in_RCX,in_R8);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int arkPredict_Bootstrap(ARKodeMem ark_mem, sunrealtype hj, sunrealtype tau,
                         int nvec, sunrealtype* cvals, N_Vector* Xvecs,
                         N_Vector yguess)
{
  sunrealtype a0, a1, a2;
  int i, retval;

  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeMem structure is NULL");
    return (ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeInterpMem structure is NULL");
    return (ARK_MEM_NULL);
  }

  /* set coefficients for Hermite interpolant */
  a0 = ONE;
  a2 = tau * tau / TWO / hj;
  a1 = tau - a2;

  /* set arrays for fused vector operation; shift inputs for
     f(t_n+hj,z_j) to end of queue */
  for (i = 0; i < nvec; i++)
  {
    cvals[2 + i] = a2 * cvals[i];
    Xvecs[2 + i] = Xvecs[i];
  }
  cvals[0] = a0;
  Xvecs[0] = ark_mem->yn;
  cvals[1] = a1;
  Xvecs[1] = ark_mem->fn;

  /* call fused vector operation to compute prediction */
  retval = N_VLinearCombination(nvec + 2, cvals, Xvecs, yguess);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }
  return (ARK_SUCCESS);
}